

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::IsConstructor(RecyclableObject *instanceObj)

{
  bool bVar1;
  int iVar2;
  bool local_49;
  JavascriptFunction *local_48;
  JavascriptProxy *local_40;
  JavascriptFunction *function;
  JavascriptProxy *proxy;
  RecyclableObject *instanceObj_local;
  
  bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(instanceObj);
  if (bVar1) {
    local_40 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(instanceObj);
  }
  else {
    local_40 = (JavascriptProxy *)0x0;
  }
  if (local_40 == (JavascriptProxy *)0x0) {
    bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(instanceObj);
    if (bVar1) {
      local_48 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(instanceObj);
    }
    else {
      local_48 = (JavascriptFunction *)0x0;
    }
    local_49 = false;
    if (local_48 != (JavascriptFunction *)0x0) {
      iVar2 = (*(local_48->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])();
      local_49 = iVar2 != 0;
    }
    instanceObj_local._7_1_ = local_49;
  }
  else {
    instanceObj_local._7_1_ = IsConstructor(local_40);
  }
  return instanceObj_local._7_1_;
}

Assistant:

bool JavascriptOperators::IsConstructor(_In_ RecyclableObject* instanceObj)
    {
        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instanceObj);
        if (proxy)
        {
            return IsConstructor(proxy);
        }

        JavascriptFunction* function = JavascriptOperators::TryFromVar<JavascriptFunction>(instanceObj);
        return function && function->IsConstructor();
    }